

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addElem
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this,Name name,TableIdxT *param_2
          ,optional<wasm::Ok> param_3,ElemListT *param_4,Index pos)

{
  undefined8 *puVar1;
  uint uVar2;
  uint __val;
  uint uVar3;
  ElementSegment *pEVar4;
  undefined1 reuse;
  uint uVar5;
  char *pcVar6;
  uint __len;
  string_view sVar7;
  string local_88;
  undefined1 local_68 [32];
  pointer pAStack_48;
  pointer local_40;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> local_38;
  __single_object e;
  
  pcVar6 = name.super_IString.str._M_str;
  local_38._M_head_impl = (ElementSegment *)operator_new(0x50);
  ((local_38._M_head_impl)->type).id = 0;
  ((local_38._M_head_impl)->data).
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_38._M_head_impl)->data).
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_38._M_head_impl)->data).
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_38._M_head_impl)->super_Named).name.super_IString.str._M_len = 0;
  ((local_38._M_head_impl)->super_Named).name.super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&((local_38._M_head_impl)->super_Named).hasExplicitName = 0;
  ((local_38._M_head_impl)->table).super_IString.str._M_len = 0;
  ((local_38._M_head_impl)->table).super_IString.str._M_str = (char *)0x0;
  (local_38._M_head_impl)->offset = (Expression *)0x0;
  ((local_38._M_head_impl)->type).id = 0x12;
  ((local_38._M_head_impl)->data).
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_38._M_head_impl)->data).
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_38._M_head_impl)->data).
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (name.super_IString.str._M_str == (char *)0x0) {
    uVar2 = this->elemCounter;
    this->elemCounter = uVar2 + 1;
    __val = -uVar2;
    if (0 < (int)uVar2) {
      __val = uVar2;
    }
    __len = 1;
    if (9 < __val) {
      pcVar6 = (char *)(ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar5 = (uint)pcVar6;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_00b8d426;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_00b8d426;
        }
        if (uVar5 < 10000) goto LAB_00b8d426;
        pcVar6 = (char *)((ulong)pcVar6 / 10000);
        uVar3 = __len + 4;
      } while (99999 < uVar5);
      __len = __len + 1;
    }
LAB_00b8d426:
    reuse = SUB81(pcVar6,0);
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_68,(char)__len - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_68._0_8_ + (ulong)(uVar2 >> 0x1f)),__len,__val);
    sVar7._M_str = (char *)0x0;
    sVar7._M_len = local_68._0_8_;
    sVar7 = IString::interned((IString *)local_68._8_8_,sVar7,(bool)reuse);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,CONCAT44(local_68._20_4_,local_68._16_4_) + 1);
    }
    name = Names::getValidElementSegmentName(this->wasm,(Name)sVar7);
    ((local_38._M_head_impl)->super_Named).name.super_IString.str =
         (string_view)name.super_IString.str;
  }
  else {
    pEVar4 = Module::getElementSegmentOrNull(this->wasm,name);
    if (pEVar4 != (ElementSegment *)0x0) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"repeated element segment name","");
      Lexer::err((Err *)local_68,&this->in,(ulong)pos,&local_88);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
      if ((undefined1 *)local_68._0_8_ == local_68 + 0x10) {
        *puVar1 = CONCAT44(local_68._20_4_,local_68._16_4_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = local_68._24_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_68._0_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             CONCAT44(local_68._20_4_,local_68._16_4_);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_68._8_8_;
      local_68._8_8_ = 0;
      local_68._0_8_ = local_68 + 0x10;
      local_68._16_4_ = local_68._16_4_ & 0xffffff00;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00b8d50b;
    }
    ((local_38._M_head_impl)->super_Named).name.super_IString.str =
         (string_view)name.super_IString.str;
    ((local_38._M_head_impl)->super_Named).hasExplicitName = true;
  }
  local_68._16_4_ = pos;
  local_68._20_4_ =
       (undefined4)
       ((ulong)((long)(this->wasm->elementSegments).
                      super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->wasm->elementSegments).
                     super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_68._24_8_ = (void *)0x0;
  pAStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  local_68._0_16_ = (undefined1  [16])name.super_IString.str;
  std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::
  emplace_back<wasm::WATParser::DefPos>(&this->elemDefs,(DefPos *)local_68);
  if ((void *)local_68._24_8_ != (void *)0x0) {
    operator_delete((void *)local_68._24_8_,(long)local_40 - local_68._24_8_);
  }
  Module::addElementSegment
            (this->wasm,
             (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
             &local_38);
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
LAB_00b8d50b:
  if (local_38._M_head_impl != (ElementSegment *)0x0) {
    std::default_delete<wasm::ElementSegment>::operator()
              ((default_delete<wasm::ElementSegment> *)&local_38,local_38._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDeclsCtx::addElem(
  Name name, TableIdxT*, std::optional<ExprT>, ElemListT&&, Index pos) {
  auto e = std::make_unique<ElementSegment>();
  if (name) {
    if (wasm.getElementSegmentOrNull(name)) {
      // TDOO: if the existing segment is not explicitly named, fix its name and
      // continue.
      return in.err(pos, "repeated element segment name");
    }
    e->setExplicitName(name);
  } else {
    name = std::to_string(elemCounter++);
    name = Names::getValidElementSegmentName(wasm, name);
    e->name = name;
  }
  // TODO: element segment annotations
  elemDefs.push_back({name, pos, Index(wasm.elementSegments.size()), {}});
  wasm.addElementSegment(std::move(e));
  return Ok{};
}